

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void distance_suite::test_array_nulls(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_148;
  undefined4 local_13c;
  iterator local_138;
  iterator local_120;
  difference_type local_108;
  nullable local_fc [6];
  nullable local_e4;
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_e0 = &local_d8;
  local_e4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,&local_e4);
  local_e0 = &local_a8;
  local_fc[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,local_fc + 1);
  local_e0 = &local_78;
  local_fc[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,local_fc);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_148 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_148 = local_148 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_148);
  } while (local_148 != &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_108 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_120,&local_138);
  local_13c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), data.end())","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x8f2,"void distance_suite::test_array_nulls()",&local_108,&local_13c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_nulls()
{
    variable data = array::make({ null, null, null });
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), data.end()), 3);
}